

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptElement * __thiscall
cfd::core::ScriptElement::operator=(ScriptElement *this,ScriptElement *element)

{
  ByteData *in_stack_ffffffffffffffd8;
  ScriptElement *element_local;
  ScriptElement *this_local;
  
  if (this != element) {
    this->type_ = element->type_;
    ScriptOperator::operator=(&this->op_code_,&element->op_code_);
    ByteData::operator=((ByteData *)this,in_stack_ffffffffffffffd8);
    this->value_ = element->value_;
  }
  return this;
}

Assistant:

ScriptElement& ScriptElement::operator=(const ScriptElement& element) {
  if (this != &element) {
    type_ = element.type_;
    op_code_ = element.op_code_;
    binary_data_ = element.binary_data_;
    value_ = element.value_;
  }
  return *this;
}